

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O1

void __thiscall
YAML::SingleDocParser::HandleCompactMap(SingleDocParser *this,EventHandler *eventHandler)

{
  deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *this_00;
  undefined4 *puVar1;
  bool bVar2;
  Token *pTVar3;
  Mark mark;
  undefined8 local_20;
  int local_18;
  
  this_00 = (deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>> *)
            (this->m_pCollectionStack)._M_t.
            super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
            ._M_t.
            super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
            .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl;
  local_20 = CONCAT44(local_20._4_4_,5);
  puVar1 = *(undefined4 **)(this_00 + 0x30);
  if (puVar1 == (undefined4 *)(*(long *)(this_00 + 0x40) + -4)) {
    std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>::
    _M_push_back_aux<YAML::CollectionType::value_const&>(this_00,(value *)&local_20);
  }
  else {
    *puVar1 = 5;
    *(undefined4 **)(this_00 + 0x30) = puVar1 + 1;
  }
  pTVar3 = Scanner::peek(this->m_scanner);
  local_20._0_4_ = (pTVar3->mark).pos;
  local_20._4_4_ = (pTVar3->mark).line;
  local_18 = (pTVar3->mark).column;
  Scanner::pop(this->m_scanner);
  HandleNode(this,eventHandler);
  bVar2 = Scanner::empty(this->m_scanner);
  if (!bVar2) {
    pTVar3 = Scanner::peek(this->m_scanner);
    if (pTVar3->type == VALUE) {
      Scanner::pop(this->m_scanner);
      HandleNode(this,eventHandler);
      goto LAB_0072858b;
    }
  }
  (*eventHandler->_vptr_EventHandler[4])(eventHandler,&local_20,0);
LAB_0072858b:
  std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::pop_back
            ((deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *)
             (this->m_pCollectionStack)._M_t.
             super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
             .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
  return;
}

Assistant:

void SingleDocParser::HandleCompactMap(EventHandler& eventHandler) {
  m_pCollectionStack->PushCollectionType(CollectionType::CompactMap);

  // grab key
  Mark mark = m_scanner.peek().mark;
  m_scanner.pop();
  HandleNode(eventHandler);

  // now grab value (optional)
  if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
    m_scanner.pop();
    HandleNode(eventHandler);
  } else {
    eventHandler.OnNull(mark, NullAnchor);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::CompactMap);
}